

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O0

VirtualIterator<Kernel::Term_*> Lib::VirtualIterator<Kernel::Term_*>::getEmpty(void)

{
  int iVar1;
  IteratorCore<Kernel::Term_*> *core;
  IteratorCore<Kernel::Term_*> *in_RDI;
  
  if (VirtualIterator<Kernel::Term*>::getEmpty()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&VirtualIterator<Kernel::Term*>::getEmpty()::inst);
    if (iVar1 != 0) {
      core = (IteratorCore<Kernel::Term_*> *)EmptyIterator<Kernel::Term*>::operator_new(0x790baa);
      EmptyIterator<Kernel::Term_*>::EmptyIterator((EmptyIterator<Kernel::Term_*> *)core);
      VirtualIterator(&getEmpty::inst,core);
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&VirtualIterator<Kernel::Term*>::getEmpty()::inst);
    }
  }
  VirtualIterator((VirtualIterator<Kernel::Term_*> *)in_RDI,&getEmpty::inst);
  return (VirtualIterator<Kernel::Term_*>)in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }